

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
* __thiscall
pstore::region::factory::create<pstore::file::file_handle,pstore::memory_mapper>
          (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           *__return_storage_ptr__,factory *this,shared_ptr<pstore::file::file_handle> *file)

{
  element_type *this_00;
  uint64_t full_size;
  uint64_t minimum_size;
  shared_ptr<pstore::file::file_handle> local_58;
  undefined1 local_48 [8];
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> builder;
  uint64_t file_size;
  shared_ptr<pstore::file::file_handle> *file_local;
  factory *this_local;
  
  this_00 = std::
            __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)file);
  builder.minimum_size_ = pstore::file::file_handle::size(this_00);
  std::shared_ptr<pstore::file::file_handle>::shared_ptr(&local_58,file);
  full_size = factory::full_size(this);
  minimum_size = min_size(this);
  region_builder<pstore::file::file_handle,_pstore::memory_mapper>::region_builder
            ((region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_48,&local_58,
             full_size,minimum_size);
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr(&local_58);
  region_builder<pstore::file::file_handle,_pstore::memory_mapper>::operator()
            (__return_storage_ptr__,
             (region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_48,
             builder.minimum_size_);
  region_builder<pstore::file::file_handle,_pstore::memory_mapper>::~region_builder
            ((region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

auto factory::create (std::shared_ptr<File> file) -> std::vector<memory_mapper_ptr> {

            // There's no lock on the file when we call the size() method here. However, the file
            // is only allowed to grow so if it changes then the worst outcome is that we end up
            // memory mapping more of it beyond the logical size.

            std::uint64_t const file_size = file->size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (),
                                                        this->min_size ());
            return builder (file_size);
        }